

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O2

unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> __thiscall
flow::lang::Parser::arrayExpr(Parser *this)

{
  Lexer *pLVar1;
  Report *pRVar2;
  undefined8 uVar3;
  pointer puVar4;
  bool bVar5;
  LiteralType args;
  LiteralType LVar6;
  Parser *in_RSI;
  pointer puVar7;
  undefined1 local_b0 [32];
  _Base_ptr local_90;
  vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
  fields;
  SourceLocation loc;
  
  SourceLocation::SourceLocation
            (&loc,&((in_RSI->lexer_)._M_t.
                    super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                    .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl)->location_);
  nextToken(in_RSI);
  fields.
  super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fields.
  super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fields.
  super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (((in_RSI->lexer_)._M_t.
       super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>._M_t.
       super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
       super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl)->token_ != BrClose) {
    logicExpr((Parser *)local_b0);
    if ((long *)local_b0._0_8_ == (long *)0x0) goto LAB_00128097;
    std::
    vector<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,std::allocator<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>>>
    ::emplace_back<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>>
              ((vector<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,std::allocator<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>>>
                *)&fields,
               (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)local_b0);
    while( true ) {
      bVar5 = consumeIf(in_RSI,Comma);
      if (!bVar5) break;
      logicExpr((Parser *)&local_90);
      uVar3 = local_b0._0_8_;
      local_b0._0_8_ = local_90;
      if ((long *)uVar3 != (long *)0x0) {
        (**(code **)(*(long *)uVar3 + 8))();
      }
      if ((long *)local_b0._0_8_ == (long *)0x0) goto LAB_00128097;
      std::
      vector<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,std::allocator<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>>>
      ::emplace_back<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>>
                ((vector<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,std::allocator<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>>>
                  *)&fields,
                 (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)local_b0);
    }
    if ((long *)local_b0._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_b0._0_8_ + 8))();
    }
  }
  consume(in_RSI,BrClose);
  if (fields.
      super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      fields.
      super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pLVar1 = (in_RSI->lexer_)._M_t.
             super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>._M_t.
             super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
             super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
    pRVar2 = in_RSI->report_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_b0,"Empty arrays are not allowed. Cannot infer element type.",
               (allocator<char> *)&local_90);
    diagnostics::Report::typeError<>(pRVar2,&pLVar1->lastLocation_,(string *)local_b0);
  }
  else {
    args = (**(code **)((long)((((fields.
                                  super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>
                                .super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl)->
                              super_ASTNode)._vptr_ASTNode + 0x18))();
    puVar4 = fields.
             super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar7 = fields.
             super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (puVar7 == puVar4) {
        if ((args < RegExp) && ((0x6cU >> (args & 0x1f) & 1) != 0)) {
          pLVar1 = (in_RSI->lexer_)._M_t.
                   super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                   .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
          loc.end.offset = *(uint *)((long)&(pLVar1->lastLocation_).end + 8);
          loc.end.line = (pLVar1->lastLocation_).end.line;
          loc.end.column = (pLVar1->lastLocation_).end.column;
          std::
          make_unique<flow::lang::ArrayExpr,flow::SourceLocation&,std::vector<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,std::allocator<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>>>>
                    ((SourceLocation *)local_b0,
                     (vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                      *)&loc);
          *(undefined8 *)&(this->features_)._M_t._M_impl = local_b0._0_8_;
          goto LAB_0012809b;
        }
        pLVar1 = (in_RSI->lexer_)._M_t.
                 super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                 .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
        pRVar2 = in_RSI->report_;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_b0,"Invalid array expression. Element type {} is not allowed.",
                   (allocator<char> *)&local_90);
        diagnostics::Report::typeError<flow::LiteralType>
                  (pRVar2,&pLVar1->lastLocation_,(string *)local_b0,args);
        goto LAB_0012808d;
      }
      LVar6 = (**(code **)((long)(((puVar7->_M_t).
                                   super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>
                                   .super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl)->
                                 super_ASTNode)._vptr_ASTNode + 0x18))();
      puVar7 = puVar7 + 1;
    } while (LVar6 == args);
    pLVar1 = (in_RSI->lexer_)._M_t.
             super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>._M_t.
             super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
             super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
    pRVar2 = in_RSI->report_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_b0,"Mixed element types in array not allowed.",
               (allocator<char> *)&local_90);
    diagnostics::Report::typeError<>(pRVar2,&pLVar1->lastLocation_,(string *)local_b0);
  }
LAB_0012808d:
  std::__cxx11::string::~string((string *)local_b0);
LAB_00128097:
  *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
LAB_0012809b:
  std::
  vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
  ::~vector(&fields);
  std::__cxx11::string::~string((string *)&loc);
  return (__uniq_ptr_data<flow::lang::Expr,_std::default_delete<flow::lang::Expr>,_true,_true>)
         (__uniq_ptr_data<flow::lang::Expr,_std::default_delete<flow::lang::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::arrayExpr() {
  SourceLocation loc = location();
  nextToken();  // '['
  std::vector<std::unique_ptr<Expr>> fields;

  if (token() != Token::BrClose) {
    auto e = expr();
    if (!e) return nullptr;

    fields.push_back(std::move(e));

    while (consumeIf(Token::Comma)) {
      e = expr();
      if (!e) return nullptr;

      fields.push_back(std::move(e));
    }
  }

  consume(Token::BrClose);

  if (!fields.empty()) {
    LiteralType baseType = fields.front()->getType();
    for (const auto& e : fields) {
      if (e->getType() != baseType) {
        report_.typeError(lastLocation(),
                          "Mixed element types in array not allowed.");
        return nullptr;
      }
    }

    switch (baseType) {
      case LiteralType::Number:
      case LiteralType::String:
      case LiteralType::IPAddress:
      case LiteralType::Cidr:
        break;
      default:
        report_.typeError(
            lastLocation(),
            "Invalid array expression. Element type {} is not allowed.",
            baseType);
        return nullptr;
    }
  } else {
    report_.typeError(
        lastLocation(),
        "Empty arrays are not allowed. Cannot infer element type.");
    return nullptr;
  }

  return std::make_unique<ArrayExpr>(loc.update(end()), std::move(fields));
}